

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

LOs __thiscall Omega_h::multiply_fans(Omega_h *this,LOs *a2b,LOs *a2c)

{
  void *extraout_RDX;
  LOs LVar1;
  allocator local_159;
  string local_158 [32];
  Read<int> local_138;
  undefined1 local_122;
  allocator local_121;
  string local_120 [32];
  Read<int> local_100;
  Read<int> local_f0;
  Write<int> local_e0;
  undefined1 local_d0 [8];
  LOs degrees;
  string local_b8 [32];
  Read<int> local_98;
  undefined1 local_88 [8];
  LOs c_degrees;
  allocator local_61;
  string local_60 [32];
  Read<int> local_40;
  undefined1 local_30 [8];
  LOs b_degrees;
  LOs *a2c_local;
  LOs *a2b_local;
  LOs *a2bc;
  
  b_degrees.write_.shared_alloc_.direct_ptr = a2c;
  Read<int>::Read(&local_40,a2b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  get_degrees((Omega_h *)local_30,&local_40,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  Read<int>::~Read(&local_40);
  Read<int>::Read(&local_98,a2c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b8,"",(allocator *)((long)&degrees.write_.shared_alloc_.direct_ptr + 7));
  get_degrees((Omega_h *)local_88,&local_98,(string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&degrees.write_.shared_alloc_.direct_ptr + 7));
  Read<int>::~Read(&local_98);
  Read<int>::Read(&local_f0,(Read<int> *)local_30);
  Read<int>::Read(&local_100,(Read<int> *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"",&local_121);
  multiply_each<int>((Omega_h *)&local_e0,&local_f0,&local_100,(string *)local_120);
  Read<int>::Read((Read<int> *)local_d0,&local_e0);
  Write<int>::~Write(&local_e0);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  Read<int>::~Read(&local_100);
  Read<int>::~Read(&local_f0);
  local_122 = 0;
  Read<int>::Read(&local_138,(Read<int> *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"",&local_159);
  offset_scan<int>(this,&local_138,(string *)local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  Read<int>::~Read(&local_138);
  local_122 = 1;
  Read<int>::~Read((Read<int> *)local_d0);
  Read<int>::~Read((Read<int> *)local_88);
  Read<int>::~Read((Read<int> *)local_30);
  LVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar1.write_.shared_alloc_;
}

Assistant:

LOs multiply_fans(LOs a2b, LOs a2c) {
  auto b_degrees = get_degrees(a2b);
  auto c_degrees = get_degrees(a2c);
  LOs degrees = multiply_each(b_degrees, c_degrees);
  auto a2bc = offset_scan(degrees);
  return a2bc;
}